

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O2

void msg_flush_split_existing(wchar_t w,int *x)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  int *p;
  wchar_t x_00;
  int *a_00;
  long lVar4;
  wchar_t c;
  wchar_t *local_48;
  ulong local_40;
  wchar_t a;
  
  wVar2 = w + L'\xfffffff8';
  if (message_column < w + L'\xfffffff8') {
    wVar2 = message_column;
  }
  wVar1 = wVar2;
  do {
    x_00 = wVar2;
    if (wVar1 <= w / 2) break;
    x_00 = wVar1 + L'\xffffffff';
    Term_what(x_00,L'\0',&a,&c);
    wVar1 = x_00;
  } while (c != L' ');
  wVar2 = message_column - x_00;
  if (wVar2 == L'\0' || message_column < x_00) {
    pwVar3 = (wchar_t *)0x0;
    p = (int *)0x0;
    message_column = wVar2;
  }
  else {
    message_column = wVar2;
    local_40 = (ulong)(uint)w;
    pwVar3 = (wchar_t *)mem_alloc((ulong)(uint)wVar2 << 2);
    p = (int *)mem_alloc((long)message_column << 2);
    a_00 = p;
    local_48 = pwVar3;
    for (lVar4 = 0; lVar4 < message_column; lVar4 = lVar4 + 1) {
      Term_what(x_00 + (int)lVar4,L'\0',a_00,pwVar3);
      pwVar3 = pwVar3 + 1;
      a_00 = a_00 + 1;
    }
    w = (wchar_t)local_40;
    pwVar3 = local_48;
  }
  Term_erase(x_00,L'\0',w);
  msg_flush(x_00 + L'\x01');
  if (L'\0' < message_column) {
    for (lVar4 = 0; lVar4 < message_column; lVar4 = lVar4 + 1) {
      Term_putch((wchar_t)lVar4,L'\0',p[lVar4],pwVar3[lVar4]);
    }
    mem_free(p);
    mem_free(pwVar3);
  }
  return;
}

Assistant:

static void msg_flush_split_existing(int w, int *x)
{
	/* Default place to split what's there */
	int split = MIN(*x, w - 8);
	int i = split;
	wchar_t *svc = NULL;
	int *sva = NULL;

	/* Find the rightmost split point. */
	while (i > w / 2) {
		int a;
		wchar_t c;

		--i;
		Term_what(i, 0, &a, &c);
		if (c == L' ') {
			split = i;
			break;
		}
	}

	/* Remember what's on and after the split point. */
	*x -= split;
	if (*x > 0) {
		svc = mem_alloc(*x * sizeof(*svc));
		sva = mem_alloc(*x * sizeof(*sva));
		for (i = 0; i < *x; ++i) {
			Term_what(i + split, 0, &sva[i], &svc[i]);
		}
	}

	Term_erase(split, 0, w);
	msg_flush(split + 1);

	/* Put back what was remembered. */
	if (*x > 0) {
		for (i = 0; i < *x; ++i) {
			Term_putch(i, 0, sva[i], svc[i]);
		}
		mem_free(sva);
		mem_free(svc);
	}
}